

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
* trial::dynamic::convert::
  overloader<std::set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
  ::into(set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
         *__return_storage_ptr__,basic_variable<std::allocator<char>_> *container,
        error_code *param_2)

{
  bool bVar1;
  const_reference __x;
  basic_variable<std::allocator<char>_> *item;
  const_iterator __end0;
  undefined1 local_48 [8];
  const_iterator __begin0;
  basic_variable<std::allocator<char>_> *__range3;
  error_code *param_1_local;
  basic_variable<std::allocator<char>_> *container_local;
  set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  *result;
  
  std::
  set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  __begin0.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._8_8_ = container;
  basic_variable<std::allocator<char>_>::begin((const_iterator *)local_48,container);
  basic_variable<std::allocator<char>_>::end
            ((const_iterator *)&item,
             (basic_variable<std::allocator<char>_> *)
             __begin0.
             super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
             .current._8_8_);
  while (bVar1 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                           ((const_iterator *)local_48,(const_iterator *)&item), bVar1) {
    __x = basic_variable<std::allocator<char>_>::const_iterator::operator*
                    ((const_iterator *)local_48);
    std::
    set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,__x);
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++((iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  *)local_48);
  }
  basic_variable<std::allocator<char>_>::const_iterator::~const_iterator((const_iterator *)&item);
  basic_variable<std::allocator<char>_>::const_iterator::~const_iterator((const_iterator *)local_48)
  ;
  return __return_storage_ptr__;
}

Assistant:

static std::set<basic_variable<Allocator>> into(const basic_variable<Allocator>& container,
                                                    std::error_code&)
    {
        std::set<basic_variable<Allocator>> result;
        for (const auto& item : container)
        {
            result.insert(item);
        }
        return result;
    }